

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuffle.h
# Opt level: O2

int pbrt::PermutationElement(uint32_t i,uint32_t l,uint32_t p)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = l - 1 >> 1 | l - 1;
  uVar2 = uVar2 >> 2 | uVar2;
  uVar2 = uVar2 >> 4 | uVar2;
  uVar2 = uVar2 >> 8 | uVar2;
  uVar2 = uVar2 >> 0x10 | uVar2;
  do {
    uVar1 = (i ^ p) * -0x1e8f76c3 ^ p >> 0x10;
    uVar1 = ((uVar1 & uVar2) >> 4 ^ p >> 8 ^ uVar1) * 0x929eb3f ^ p >> 0x17;
    uVar1 = ((uVar1 & uVar2) >> 1 ^ uVar1) * (p >> 0x1b | 1) * 0x6935fa69;
    uVar1 = ((uVar1 & uVar2) >> 0xb ^ uVar1) * 0x74dcb303;
    uVar1 = ((uVar1 & uVar2) >> 2 ^ uVar1) * -0x61afe33d;
    uVar1 = ((uVar1 & uVar2) >> 2 ^ uVar1) * -0x379f5c21 & uVar2;
    i = uVar1 >> 5 ^ uVar1;
  } while (l <= i);
  return (i + p) % l;
}

Assistant:

PBRT_CPU_GPU
inline int PermutationElement(uint32_t i, uint32_t l, uint32_t p) {
    uint32_t w = l - 1;
    w |= w >> 1;
    w |= w >> 2;
    w |= w >> 4;
    w |= w >> 8;
    w |= w >> 16;
    do {
        i ^= p;
        i *= 0xe170893d;
        i ^= p >> 16;
        i ^= (i & w) >> 4;
        i ^= p >> 8;
        i *= 0x0929eb3f;
        i ^= p >> 23;
        i ^= (i & w) >> 1;
        i *= 1 | p >> 27;
        i *= 0x6935fa69;
        i ^= (i & w) >> 11;
        i *= 0x74dcb303;
        i ^= (i & w) >> 2;
        i *= 0x9e501cc3;
        i ^= (i & w) >> 2;
        i *= 0xc860a3df;
        i &= w;
        i ^= i >> 5;
    } while (i >= l);
    return (i + p) % l;
}